

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O1

size_t Tools::leaf_index(bitset_t *split)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  size_type sVar4;
  invalid_argument *this;
  ulong uVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  puVar1 = (split->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (split->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar2 == puVar1) {
LAB_00154eb2:
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar7 = lVar7 + (ulong)(byte)boost::detail::dynamic_bitset_impl::count_table<true>::table
                                   [*(byte *)((long)puVar1 + lVar6)];
      lVar6 = lVar6 + 1;
    } while ((long)puVar2 - (long)puVar1 != lVar6);
    if (lVar7 == 1) {
      sVar8 = split->m_num_bits;
      sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                        (split,0);
      uVar5 = ~sVar4;
      goto LAB_00154efb;
    }
    if (puVar2 == puVar1) goto LAB_00154eb2;
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + (ulong)(byte)boost::detail::dynamic_bitset_impl::count_table<true>::table
                                   [*(byte *)((long)puVar1 + lVar7)];
      lVar7 = lVar7 + 1;
    } while ((long)puVar2 - (long)puVar1 != lVar7);
  }
  uVar5 = split->m_num_bits;
  if (lVar6 != uVar5 - 1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Not a leaf");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~(&local_30,split);
  sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                    (&local_30,0);
  bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_30);
  if (!bVar3) {
    __assert_fail("m_check_invariants()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                  ,0x279,
                  "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                 );
  }
  sVar8 = ~sVar4;
  if (local_30.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00154efb:
  return uVar5 + sVar8;
}

Assistant:

size_t Tools::leaf_index(const bitset_t split) {
    if (split.count() == 1) {
        return split.size() - split.find_first() - 1;
    }
    else if (split.count() == split.size() - 1) {
        return split.size() - (~split).find_first() - 1;
    }
    else {
        throw std::invalid_argument("Not a leaf");
    }
}